

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

int __thiscall lzham::lzcompressor::init(lzcompressor *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  compression_level cVar2;
  task_pool *ptVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  raw_parse_thread_state *prVar7;
  int iVar8;
  uint uVar9;
  state *this_00;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  
  clear(this);
  if ((0xfffffff0 < *(int *)(ctx + 0x10) - 0x1eU) && (*(uint *)(ctx + 0xc) < 6)) {
    uVar4 = *(undefined8 *)(ctx + 8);
    uVar5 = *(undefined8 *)(ctx + 0x10);
    uVar6 = *(undefined8 *)(ctx + 0x18);
    (this->m_params).m_pTask_pool = *(task_pool **)ctx;
    (this->m_params).m_max_helper_threads = (int)uVar4;
    (this->m_params).m_compression_level = (int)((ulong)uVar4 >> 0x20);
    (this->m_params).m_lzham_compress_flags = *(uint *)(ctx + 0x20);
    (this->m_params).m_dict_size_log2 = (int)uVar5;
    (this->m_params).m_block_size = (int)((ulong)uVar5 >> 0x20);
    (this->m_params).m_num_cachelines = (int)uVar6;
    (this->m_params).m_cacheline_size = (int)((ulong)uVar6 >> 0x20);
    ptVar3 = (this->m_params).m_pTask_pool;
    if ((ptVar3 == (task_pool *)0x0) || (ptVar3->m_num_threads == 0)) {
      bVar12 = false;
    }
    else {
      bVar12 = (this->m_params).m_max_helper_threads != 0;
    }
    this->m_use_task_pool = bVar12;
    if ((this->m_params).m_max_helper_threads == 0 || bVar12 != false) {
      uVar4 = *(undefined8 *)(s_settings + (ulong)*(uint *)(ctx + 0xc) * 0x10);
      uVar5 = *(undefined8 *)(s_settings + (ulong)*(uint *)(ctx + 0xc) * 0x10 + 8);
      (this->m_settings).m_fast_bytes = (int)uVar4;
      (this->m_settings).m_fast_adaptive_huffman_updating = (bool)(char)((ulong)uVar4 >> 0x20);
      (this->m_settings).m_use_polar_codes = (bool)(char)((ulong)uVar4 >> 0x28);
      *(short *)&(this->m_settings).field_0x6 = (short)((ulong)uVar4 >> 0x30);
      (this->m_settings).m_match_accel_max_matches_per_probe = (int)uVar5;
      (this->m_settings).m_match_accel_max_probes = (int)((ulong)uVar5 >> 0x20);
      uVar11 = (this->m_params).m_lzham_compress_flags;
      if ((uVar11 & 1) != 0) {
        (this->m_settings).m_use_polar_codes = true;
      }
      uVar1 = (uint)(1 << ((byte)(this->m_params).m_dict_size_log2 & 0x1f)) >> 3;
      if (uVar1 < (this->m_params).m_block_size) {
        (this->m_params).m_block_size = uVar1;
      }
      this->m_num_parse_threads = 1;
      uVar1 = *(uint *)(ctx + 8);
      if (uVar1 != 0) {
        if ((this->m_params).m_block_size < 0x4000) {
          uVar9 = 8;
          if (uVar1 + 1 < 8) {
            uVar9 = uVar1 + 1;
          }
        }
        else {
          uVar9 = 1;
          if ((((uVar1 != 1) &&
               (cVar2 = (this->m_params).m_compression_level, cVar2 != cCompressionLevelFastest)) &&
              (uVar9 = 2, 3 < uVar1)) && (uVar9 = 4, uVar1 < 8)) {
            uVar9 = 2;
            if ((uVar11 & 2) != 0) {
              uVar9 = (uint)(cVar2 == cCompressionLevelUber) * 2 + 2;
            }
          }
        }
        this->m_num_parse_threads = uVar9;
      }
      iVar8 = search_accelerator::init(&this->m_accel,(EVP_PKEY_CTX *)this);
      if ((char)iVar8 == '\0') {
        return 0;
      }
      CLZDecompBase::init_position_slots((CLZDecompBase *)this,*(uint *)(ctx + 0x10));
      CLZBase::init_slot_tabs(&this->super_CLZBase);
      iVar8 = state::init(&this->m_state,(EVP_PKEY_CTX *)this);
      if ((char)iVar8 != '\0') {
        bVar12 = elemental_vector::increase_capacity
                           ((elemental_vector *)&this->m_block_buf,(this->m_params).m_block_size,
                            true,1,(object_mover)0x0,true);
        if (!bVar12) {
          return 0;
        }
        bVar12 = elemental_vector::increase_capacity
                           ((elemental_vector *)&this->m_comp_buf,(this->m_params).m_block_size * 2,
                            true,1,(object_mover)0x0,true);
        if (!bVar12) {
          return 0;
        }
        bVar12 = this->m_num_parse_threads == 0;
        uVar11 = (uint)bVar12;
        if (bVar12) {
          return uVar11;
        }
        iVar8 = state::init(&this->m_parse_thread_state[0].super_raw_parse_thread_state.
                             m_approx_state,(EVP_PKEY_CTX *)this);
        if ((char)iVar8 == '\0') {
          return uVar11;
        }
        prVar7 = &this->m_parse_thread_state[1].super_raw_parse_thread_state;
        uVar10 = 0;
        do {
          this_00 = &prVar7->m_approx_state;
          uVar10 = uVar10 + 1;
          bVar12 = this->m_num_parse_threads <= uVar10;
          uVar11 = (uint)bVar12;
          if (bVar12) {
            return uVar11;
          }
          prVar7 = (raw_parse_thread_state *)((long)(this_00 + 0x26) + 0x3e68);
          iVar8 = state::init(this_00,(EVP_PKEY_CTX *)this);
        } while ((char)iVar8 != '\0');
        return uVar11;
      }
    }
  }
  return 0;
}

Assistant:

bool lzcompressor::init(const init_params& params)
   {
      clear();

      if ((params.m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (params.m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
         return false;
      if ((params.m_compression_level < 0) || (params.m_compression_level > cCompressionLevelCount))
         return false;

      m_params = params;
      m_use_task_pool = (m_params.m_pTask_pool) && (m_params.m_pTask_pool->get_num_threads() != 0) && (m_params.m_max_helper_threads > 0);
      if ((m_params.m_max_helper_threads) && (!m_use_task_pool))
         return false;
      m_settings = s_settings[params.m_compression_level];

      if (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_FORCE_POLAR_CODING)
         m_settings.m_use_polar_codes = true;

      const uint dict_size = 1U << m_params.m_dict_size_log2;

      uint max_block_size = dict_size / 8;
      if (m_params.m_block_size > max_block_size)
      {
         m_params.m_block_size = max_block_size;
      }

      m_num_parse_threads = 1;

#if !LZHAM_FORCE_SINGLE_THREADED_PARSING
      if (params.m_max_helper_threads > 0)
      {
         LZHAM_ASSUME(cMaxParseThreads >= 4);

         if (m_params.m_block_size < 16384)
         {
            m_num_parse_threads = LZHAM_MIN(cMaxParseThreads, params.m_max_helper_threads + 1);
         }
         else
         {
            if ((params.m_max_helper_threads == 1) || (m_params.m_compression_level == cCompressionLevelFastest))
            {
               m_num_parse_threads = 1;
            }
            else if (params.m_max_helper_threads <= 3)
            {
               m_num_parse_threads = 2;
            }
            else if (params.m_max_helper_threads <= 7)
            {
               if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) && (m_params.m_compression_level == cCompressionLevelUber))
                  m_num_parse_threads = 4;
               else
                  m_num_parse_threads = 2;
            }
            else
            {
               // 8-16
               m_num_parse_threads = 4;
            }
         }
      }
#endif

      int num_parse_jobs = m_num_parse_threads - 1;
      uint match_accel_helper_threads = LZHAM_MAX(0, (int)params.m_max_helper_threads - num_parse_jobs);

      LZHAM_ASSERT(m_num_parse_threads >= 1);
      LZHAM_ASSERT(m_num_parse_threads <= cMaxParseThreads);

      if (!m_use_task_pool)
      {
         LZHAM_ASSERT(!match_accel_helper_threads && (m_num_parse_threads == 1));
      }
      else
      {
         LZHAM_ASSERT((match_accel_helper_threads + (m_num_parse_threads - 1)) <= params.m_max_helper_threads);
      }

      if (!m_accel.init(this, params.m_pTask_pool, match_accel_helper_threads, dict_size, m_settings.m_match_accel_max_matches_per_probe, false, m_settings.m_match_accel_max_probes))
         return false;

      init_position_slots(params.m_dict_size_log2);
      init_slot_tabs();

      if (!m_state.init(*this, m_settings.m_fast_adaptive_huffman_updating, m_settings.m_use_polar_codes))
         return false;

      if (!m_block_buf.try_reserve(m_params.m_block_size))
         return false;

      if (!m_comp_buf.try_reserve(m_params.m_block_size*2))
         return false;

      for (uint i = 0; i < m_num_parse_threads; i++)
      {
         if (!m_parse_thread_state[i].m_approx_state.init(*this, m_settings.m_fast_adaptive_huffman_updating, m_settings.m_use_polar_codes))
            return false;
      }

      return true;
   }